

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_5.cpp
# Opt level: O3

int main(void)

{
  istream *this;
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int l;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  int j;
  ulong uVar12;
  int (*paiVar13) [55];
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  int m;
  int n;
  uint local_60;
  uint local_5c;
  int *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_5c);
  std::istream::operator>>(this,(int *)&local_60);
  iVar4 = -0x3ed;
  if (0 < (int)local_5c) {
    paiVar13 = a;
    uVar3 = (ulong)local_60;
    lVar15 = 0;
    uVar7 = local_5c;
    do {
      if (0 < (int)uVar3) {
        lVar5 = 0;
        piVar10 = *paiVar13;
        do {
          std::istream::operator>>((istream *)&std::cin,piVar10);
          lVar5 = lVar5 + 1;
          uVar3 = (ulong)(int)local_60;
          piVar10 = piVar10 + 1;
          uVar7 = local_5c;
        } while (lVar5 < (long)uVar3);
      }
      lVar15 = lVar15 + 1;
      paiVar13 = (int (*) [55])((long)paiVar13 + 0xdc);
    } while (lVar15 < (int)uVar7);
    if (0 < (int)uVar7) {
      local_50 = (ulong)local_60;
      local_48 = (ulong)uVar7;
      local_38 = (ulong)(uVar7 + 1);
      iVar4 = -0x3ed;
      local_58 = a[0];
      uVar1 = 0;
      uVar3 = 1;
      do {
        local_40 = uVar3;
        uVar12 = uVar1 & 0xffffffff;
        uVar3 = local_40;
        do {
          if (0 < (int)local_60) {
            uVar16 = 1;
            uVar14 = 0;
            piVar10 = local_58;
            do {
              lVar15 = 1;
              uVar8 = uVar14 & 0xffffffff;
              uVar6 = uVar16;
              do {
                iVar9 = 0;
                if ((uint)uVar1 <= (uint)uVar12) {
                  iVar9 = 0;
                  uVar11 = uVar1;
                  piVar17 = piVar10;
                  do {
                    if ((uint)uVar14 <= (uint)uVar8) {
                      lVar5 = 0;
                      do {
                        iVar9 = iVar9 + (*(int (*) [55])piVar17)[lVar5];
                        lVar5 = lVar5 + 1;
                      } while (lVar15 != lVar5);
                    }
                    uVar11 = uVar11 + 1;
                    piVar17 = (int *)((long)piVar17 + 0xdc);
                  } while (uVar11 != uVar3);
                }
                if (iVar4 < iVar9) {
                  iVar4 = iVar9;
                }
                uVar8 = (ulong)((uint)uVar8 + 1);
                uVar6 = uVar6 + 1;
                lVar15 = lVar15 + 1;
              } while (uVar6 != local_60 + 1);
              uVar14 = uVar14 + 1;
              uVar16 = uVar16 + 1;
              piVar10 = piVar10 + 1;
            } while (uVar14 != local_50);
          }
          uVar12 = (ulong)((uint)uVar12 + 1);
          uVar3 = uVar3 + 1;
        } while (uVar3 != local_38);
        uVar1 = uVar1 + 1;
        local_58 = local_58 + 0x37;
        uVar3 = local_40 + 1;
      } while (uVar1 != local_48);
    }
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    int n,m,ans;                        //一共有n行，m列，ans用记录和的结果；
    cin >> n >> m;
    ans = -1005;                        //由于最后的结果可能
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j <m; ++j) {
            cin >> a[i][j];
        }
    }
    for(int i = 0; i < n; i++)                                          //以下四个for循环实在暴力遍历找出所有的子矩阵
    {
        for (int j = i;j < n; j++)
        {
            for (int k = 0; k < m; ++k)
            {
                for (int l = k; l < m; ++l)
                {
                    //把子矩阵中所有元素加起来，
                    int temp = 0;   //暂时储存运算结果，来和ans比较，避免零矩阵的情况
                    for (int p = i; p <= j; p++)                        //i代表的是子矩阵行的起点，j代表的是子矩阵行的终点
                    {
                        for(int q = k; q <= l; q++)                     //k代表的是子矩阵列的起点，j代表的是子矩阵列的终点
                        {
                          temp += a[p][q];
                        }
                    }
                    //如果temp比ans的值大，就把结果赋给ans，
                    if(temp > ans)
                        ans = temp;
                }
            }
        }
    }
    cout << ans << endl;
    return 0;

}